

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O2

void __thiscall Assimp::D3MF::XmlSerializer::ImportXml(XmlSerializer *this,aiScene *scene)

{
  pointer pMVar1;
  pointer pMVar2;
  pointer __src;
  pointer __src_00;
  pointer __src_01;
  pointer ppaVar3;
  bool bVar4;
  __type _Var5;
  uint uVar6;
  aiNode *paVar7;
  aiMetadata *paVar8;
  aiMesh **__s;
  aiMaterial **__dest;
  aiNode **__s_00;
  size_t i;
  long lVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong __n;
  vector<aiNode_*,_std::allocator<aiNode_*>_> children;
  string nodeName;
  aiString val;
  _Vector_base<aiNode_*,_std::allocator<aiNode_*>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  aiString local_438;
  
  if (scene != (aiScene *)0x0) {
    paVar7 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar7);
    scene->mRootNode = paVar7;
    local_478._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_478._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_478._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    local_458._M_string_length = 0;
    local_458.field_2._M_local_buf[0] = '\0';
    while( true ) {
      bVar4 = ReadToEndElement(this,(string *)XmlTag::model_abi_cxx11_);
      if (!bVar4) break;
      (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
      std::__cxx11::string::assign((char *)&local_458);
      _Var5 = std::operator==(&local_458,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              XmlTag::object_abi_cxx11_);
      if (_Var5) {
        local_438._0_8_ = ReadObject(this,scene);
        std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                  ((vector<aiNode*,std::allocator<aiNode*>> *)&local_478,(aiNode **)&local_438);
      }
      else {
        _Var5 = std::operator==(&local_458,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )XmlTag::build_abi_cxx11_);
        if (!_Var5) {
          _Var5 = std::operator==(&local_458,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)XmlTag::basematerials_abi_cxx11_);
          if (_Var5) {
            ReadBaseMaterials(this);
          }
          else {
            _Var5 = std::operator==(&local_458,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)XmlTag::meta_abi_cxx11_);
            if (_Var5) {
              ReadMetadata(this);
            }
          }
        }
      }
    }
    if ((scene->mRootNode->mName).length == 0) {
      aiString::Set(&scene->mRootNode->mName,"3MF");
    }
    pMVar1 = (this->mMetaData).
             super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar2 = (this->mMetaData).
             super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar1 != pMVar2) {
      lVar12 = (long)pMVar2 - (long)pMVar1 >> 6;
      paVar8 = aiMetadata::Alloc((uint)lVar12);
      scene->mMetaData = paVar8;
      lVar11 = 0;
      for (lVar9 = 0; lVar12 != lVar9; lVar9 = lVar9 + 1) {
        pMVar1 = (this->mMetaData).
                 super__Vector_base<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar13 = *(ulong *)((long)&(pMVar1->value)._M_string_length + lVar11);
        sVar10 = uVar13 & 0xffffffff;
        if ((uVar13 & 0xfffffc00) != 0) {
          sVar10 = 0x3ff;
        }
        local_438.length = (int)sVar10;
        memcpy((void *)((long)&local_438 + 4),
               *(void **)((long)&(pMVar1->value)._M_dataplus._M_p + lVar11),sVar10);
        *(undefined1 *)((long)&local_438 + sVar10 + 4) = 0;
        aiMetadata::Set<aiString>
                  (scene->mMetaData,(uint)lVar9,
                   (string *)((long)&(pMVar1->name)._M_dataplus._M_p + lVar11),&local_438);
        lVar11 = lVar11 + 0x40;
      }
    }
    uVar13 = (long)(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    scene->mNumMeshes = (uint)(uVar13 >> 3);
    uVar13 = uVar13 & 0x7fffffff8;
    __s = (aiMesh **)operator_new__(uVar13);
    memset(__s,0,uVar13);
    scene->mMeshes = __s;
    __src = (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start;
    sVar10 = (long)(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)__src;
    if (sVar10 != 0) {
      memmove(__s,__src,sVar10);
    }
    uVar13 = (long)(this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (uint)(uVar13 >> 3);
    scene->mNumMaterials = uVar6;
    if (uVar6 != 0) {
      __dest = (aiMaterial **)operator_new__(uVar13 & 0x7fffffff8);
      scene->mMaterials = __dest;
      __src_00 = (this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      sVar10 = (long)(this->mMatArray).
                     super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)__src_00;
      if (sVar10 != 0) {
        memmove(__dest,__src_00,sVar10);
      }
    }
    ppaVar3 = local_478._M_impl.super__Vector_impl_data._M_finish;
    __src_01 = local_478._M_impl.super__Vector_impl_data._M_start;
    __n = (long)local_478._M_impl.super__Vector_impl_data._M_finish -
          (long)local_478._M_impl.super__Vector_impl_data._M_start;
    scene->mRootNode->mNumChildren = (uint)(__n >> 3);
    paVar7 = scene->mRootNode;
    uVar13 = (ulong)paVar7->mNumChildren << 3;
    __s_00 = (aiNode **)operator_new__(uVar13);
    memset(__s_00,0,uVar13);
    paVar7->mChildren = __s_00;
    if (ppaVar3 != __src_01) {
      memmove(scene->mRootNode->mChildren,__src_01,__n);
    }
    std::__cxx11::string::~string((string *)&local_458);
    std::_Vector_base<aiNode_*,_std::allocator<aiNode_*>_>::~_Vector_base(&local_478);
  }
  return;
}

Assistant:

void ImportXml(aiScene* scene) {
        if ( nullptr == scene ) {
            return;
        }

        scene->mRootNode = new aiNode();
        std::vector<aiNode*> children;

        std::string nodeName;
        while(ReadToEndElement(D3MF::XmlTag::model)) {
            nodeName = xmlReader->getNodeName();
            if( nodeName == D3MF::XmlTag::object) {
                children.push_back(ReadObject(scene));
            } else if( nodeName == D3MF::XmlTag::build) {
                // 
            } else if ( nodeName == D3MF::XmlTag::basematerials ) {
                ReadBaseMaterials();
            } else if ( nodeName == D3MF::XmlTag::meta ) {
                ReadMetadata();
            }
        }

        if ( scene->mRootNode->mName.length == 0 ) {
            scene->mRootNode->mName.Set( "3MF" );
        }

        // import the metadata
        if ( !mMetaData.empty() ) {
            const size_t numMeta( mMetaData.size() );
            scene->mMetaData = aiMetadata::Alloc(static_cast<unsigned int>( numMeta ) );
            for ( size_t i = 0; i < numMeta; ++i ) {
                aiString val( mMetaData[ i ].value );
                scene->mMetaData->Set(static_cast<unsigned int>( i ), mMetaData[ i ].name, val );
            }
        }

        // import the meshes
        scene->mNumMeshes = static_cast<unsigned int>( mMeshes.size());
        scene->mMeshes = new aiMesh*[scene->mNumMeshes]();
        std::copy( mMeshes.begin(), mMeshes.end(), scene->mMeshes);

        // import the materials
        scene->mNumMaterials = static_cast<unsigned int>( mMatArray.size() );
        if ( 0 != scene->mNumMaterials ) {
            scene->mMaterials = new aiMaterial*[ scene->mNumMaterials ];
            std::copy( mMatArray.begin(), mMatArray.end(), scene->mMaterials );
        }

        // create the scenegraph
        scene->mRootNode->mNumChildren = static_cast<unsigned int>(children.size());
        scene->mRootNode->mChildren = new aiNode*[scene->mRootNode->mNumChildren]();
        std::copy(children.begin(), children.end(), scene->mRootNode->mChildren);
    }